

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

int ptls_esni_init_context
              (ptls_context_t *ctx,ptls_esni_context_t *esni,ptls_iovec_t esni_keys,
              ptls_key_exchange_context_t **key_exchanges)

{
  long *plVar1;
  ushort *end;
  int iVar2;
  ptls_key_exchange_context_t **pppVar3;
  ulong uVar4;
  anon_struct_72_2_510fbff9 *paVar5;
  ptls_cipher_suite_t *ppVar6;
  ptls_hash_context_t *ppVar7;
  ulong uVar8;
  ushort *puVar9;
  ushort *puVar10;
  uint8_t *puVar11;
  ushort *puVar12;
  int iVar13;
  size_t __size;
  ulong uVar14;
  ptls_key_exchange_context_t *ppVar15;
  long lVar16;
  long lVar17;
  long local_58;
  long local_50;
  ushort *local_38;
  
  uVar8 = esni_keys.len;
  puVar11 = esni_keys.base;
  __size = 0;
  do {
    plVar1 = (long *)((long)key_exchanges + __size);
    __size = __size + 8;
  } while (*plVar1 != 0);
  esni->not_before = 0;
  esni->not_after = 0;
  esni->cipher_suites = (anon_struct_72_2_510fbff9 *)0x0;
  *(undefined8 *)&esni->padded_length = 0;
  pppVar3 = (ptls_key_exchange_context_t **)malloc(__size);
  esni->key_exchanges = pppVar3;
  if (pppVar3 != (ptls_key_exchange_context_t **)0x0) {
    memcpy(pppVar3,key_exchanges,__size);
    iVar2 = 0x33;
    if ((((long)uVar8 < 6) || (iVar13 = 0x32, iVar2 = iVar13, (uVar8 & 0x7ffffffffffffffe) == 6)) ||
       (uVar4 = (ulong)(ushort)(*(ushort *)(puVar11 + 6) << 8 | *(ushort *)(puVar11 + 6) >> 8),
       uVar8 - 8 < uVar4)) goto LAB_00112cd5;
    end = (ushort *)(puVar11 + uVar8);
    puVar12 = (ushort *)(puVar11 + 8);
    puVar9 = (ushort *)(puVar11 + uVar4 + 8);
    do {
      if (((long)puVar9 - (long)puVar12 < 2) || (((long)puVar9 - (long)puVar12) - 2U < 2))
      goto LAB_00112cd5;
      uVar14 = (ulong)(ushort)(puVar12[1] << 8 | puVar12[1] >> 8);
      if ((ulong)((long)puVar9 - (long)(puVar12 + 2)) < uVar14) goto LAB_00112cd5;
      ppVar15 = *key_exchanges;
      if (ppVar15 != (ptls_key_exchange_context_t *)0x0) {
        pppVar3 = key_exchanges + 1;
        do {
          if (ppVar15->algo->id == (uint16_t)(*puVar12 << 8 | *puVar12 >> 8)) break;
          ppVar15 = *pppVar3;
          pppVar3 = pppVar3 + 1;
        } while (ppVar15 != (ptls_key_exchange_context_t *)0x0);
      }
      puVar12 = (ushort *)((long)(puVar12 + 2) + uVar14);
    } while (puVar12 != puVar9);
    if ((ulong)((long)end - (long)puVar9) < 2) goto LAB_00112cd5;
    uVar14 = (ulong)(ushort)(*puVar9 << 8 | *puVar9 >> 8);
    puVar12 = (ushort *)(puVar11 + uVar4 + 10);
    if ((ulong)((long)end - (long)puVar12) < uVar14) goto LAB_00112cd5;
    puVar9 = (ushort *)(uVar14 + (long)puVar12);
    paVar5 = (anon_struct_72_2_510fbff9 *)0x0;
    lVar16 = 0;
    do {
      puVar10 = puVar12;
      if ((long)puVar9 - (long)puVar10 < 2) goto LAB_00112cd5;
      ppVar6 = *ctx->cipher_suites;
      if (ppVar6 != (ptls_cipher_suite_t *)0x0) {
        lVar17 = 0;
        do {
          if (ppVar6->id == (uint16_t)(*puVar10 << 8 | *puVar10 >> 8)) {
            paVar5 = (anon_struct_72_2_510fbff9 *)realloc(paVar5,(lVar16 * 8 + 8) * 9);
            if (paVar5 == (anon_struct_72_2_510fbff9 *)0x0) goto LAB_00112cd0;
            esni->cipher_suites = paVar5;
            paVar5[lVar16].cipher_suite =
                 *(ptls_cipher_suite_t **)((long)ctx->cipher_suites + lVar17);
            lVar16 = lVar16 + 1;
            break;
          }
          ppVar6 = *(ptls_cipher_suite_t **)((long)ctx->cipher_suites + lVar17 + 8);
          lVar17 = lVar17 + 8;
        } while (ppVar6 != (ptls_cipher_suite_t *)0x0);
      }
      puVar12 = puVar10 + 1;
    } while (puVar10 + 1 != puVar9);
    paVar5 = (anon_struct_72_2_510fbff9 *)realloc(paVar5,lVar16 * 0x48 + 0x48);
    if (paVar5 != (anon_struct_72_2_510fbff9 *)0x0) {
      esni->cipher_suites = paVar5;
      paVar5[lVar16].cipher_suite = (ptls_cipher_suite_t *)0x0;
      if ((long)end - (long)puVar9 < 2) goto LAB_00112cd5;
      esni->padded_length = puVar10[1] << 8 | puVar10[1] >> 8;
      local_38 = puVar10 + 2;
      iVar2 = ptls_decode64(&esni->not_before,(uint8_t **)&local_38,(uint8_t *)end);
      if (((iVar2 != 0) ||
          (iVar2 = ptls_decode64(&esni->not_after,(uint8_t **)&local_38,(uint8_t *)end), iVar2 != 0)
          ) || (iVar2 = iVar13, (ulong)((long)end - (long)local_38) < 2)) goto LAB_00112cd5;
      uVar4 = (ulong)(ushort)(*local_38 << 8 | *local_38 >> 8);
      puVar12 = local_38 + 1;
      if ((ulong)((long)end - (long)puVar12) < uVar4) goto LAB_00112cd5;
      puVar10 = (ushort *)(uVar4 + (long)puVar12);
      puVar9 = puVar12;
      for (; puVar12 != puVar10; puVar12 = (ushort *)((long)(puVar12 + 2) + uVar4)) {
        if (((long)puVar10 - (long)puVar12 < 2) || (((long)puVar10 - (long)puVar12) - 2U < 2))
        goto LAB_00112cd5;
        uVar4 = (ulong)(ushort)(puVar12[1] << 8 | puVar12[1] >> 8);
        if ((ulong)((long)puVar10 - (long)(puVar12 + 2)) < uVar4) goto LAB_00112cd5;
        puVar9 = puVar10;
      }
      if (puVar9 != end) goto LAB_00112cd5;
      paVar5 = esni->cipher_suites;
      ppVar6 = paVar5->cipher_suite;
      if (ppVar6 == (ptls_cipher_suite_t *)0x0) {
        return 0;
      }
      local_50 = 0x48;
      local_58 = 0;
      while (ppVar7 = (*ppVar6->hash->create)(), ppVar7 != (ptls_hash_context_t *)0x0) {
        (*ppVar7->update)(ppVar7,puVar11,uVar8);
        (*ppVar7->final)(ppVar7,paVar5->record_digest,PTLS_HASH_FINAL_MODE_FREE);
        local_58 = local_58 + 1;
        paVar5 = esni->cipher_suites + local_58;
        ppVar6 = *(ptls_cipher_suite_t **)(esni->cipher_suites->record_digest + local_50 + -8);
        local_50 = local_50 + 0x48;
        if (ppVar6 == (ptls_cipher_suite_t *)0x0) {
          return 0;
        }
      }
    }
  }
LAB_00112cd0:
  iVar2 = 0x201;
LAB_00112cd5:
  ptls_esni_dispose_context(esni);
  return iVar2;
}

Assistant:

int ptls_esni_init_context(ptls_context_t *ctx, ptls_esni_context_t *esni, ptls_iovec_t esni_keys,
                           ptls_key_exchange_context_t **key_exchanges)
{
    const uint8_t *src = esni_keys.base, *const end = src + esni_keys.len;
    size_t num_key_exchanges, num_cipher_suites = 0;
    int ret;

    for (num_key_exchanges = 0; key_exchanges[num_key_exchanges] != NULL; ++num_key_exchanges)
        ;

    memset(esni, 0, sizeof(*esni));
    if ((esni->key_exchanges = malloc(sizeof(*esni->key_exchanges) * (num_key_exchanges + 1))) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }
    memcpy(esni->key_exchanges, key_exchanges, sizeof(*esni->key_exchanges) * (num_key_exchanges + 1));

    /* ESNIKeys */
    if (end - src < 6) {
        ret = PTLS_ALERT_DECRYPT_ERROR;
        goto Exit;
    }
    src += 6;
    ptls_decode_open_block(src, end, 2, {
        do {
            /* parse */
            uint16_t id;
            if ((ret = ptls_decode16(&id, &src, end)) != 0)
                goto Exit;
            ptls_decode_open_block(src, end, 2, { src = end; });
            /* check that matching key-share exists */
            ptls_key_exchange_context_t **found;
            for (found = key_exchanges; *found != NULL; ++found)
                if ((*found)->algo->id == id)
                    break;
            if (found == NULL) {
                ret = PTLS_ERROR_INCOMPATIBLE_KEY;
                goto Exit;
            }
        } while (src != end);
    });
    ptls_decode_open_block(src, end, 2, {
        void *newp;
        do {
            uint16_t id;
            if ((ret = ptls_decode16(&id, &src, end)) != 0)
                goto Exit;
            size_t i;
            for (i = 0; ctx->cipher_suites[i] != NULL; ++i)
                if (ctx->cipher_suites[i]->id == id)
                    break;
            if (ctx->cipher_suites[i] != NULL) {
                if ((newp = realloc(esni->cipher_suites, sizeof(*esni->cipher_suites) * (num_cipher_suites + 1))) == NULL) {
                    ret = PTLS_ERROR_NO_MEMORY;
                    goto Exit;
                }
                esni->cipher_suites = newp;
                esni->cipher_suites[num_cipher_suites++].cipher_suite = ctx->cipher_suites[i];
            }
        } while (src != end);
        if ((newp = realloc(esni->cipher_suites, sizeof(*esni->cipher_suites) * (num_cipher_suites + 1))) == NULL) {
            ret = PTLS_ERROR_NO_MEMORY;
            goto Exit;
        }
        esni->cipher_suites = newp;
        esni->cipher_suites[num_cipher_suites].cipher_suite = NULL;
    });
    if ((ret = ptls_decode16(&esni->padded_length, &src, end)) != 0)
        goto Exit;
    if ((ret = ptls_decode64(&esni->not_before, &src, end)) != 0)
        goto Exit;
    if ((ret = ptls_decode64(&esni->not_after, &src, end)) != 0)
        goto Exit;
    ptls_decode_block(src, end, 2, {
        while (src != end) {
            uint16_t ext_type;
            if ((ret = ptls_decode16(&ext_type, &src, end)) != 0)
                goto Exit;
            ptls_decode_open_block(src, end, 2, { src = end; });
        }
    });

    { /* calculate digests for every cipher-suite */
        size_t i;
        for (i = 0; esni->cipher_suites[i].cipher_suite != NULL; ++i) {
            if ((ret = ptls_calc_hash(esni->cipher_suites[i].cipher_suite->hash, esni->cipher_suites[i].record_digest,
                                      esni_keys.base, esni_keys.len)) != 0)
                goto Exit;
        }
    }

    ret = 0;
Exit:
    if (ret != 0)
        ptls_esni_dispose_context(esni);
    return ret;
}